

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMove7<(moira::Instr)71,(moira::Mode)3,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  bool error;
  u32 data;
  u32 ea;
  bool local_29;
  uint local_28;
  u32 local_24;
  
  bVar1 = readOp<(moira::Mode)3,(moira::Size)2,0ul>(this,opcode & 7,&local_24,&local_28);
  if (bVar1) {
    (this->reg).sr.n = (bool)((byte)(local_28 >> 0xf) & 1);
    (this->reg).sr.z = (short)local_28 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar2 = computeEA<(moira::Mode)7,(moira::Size)2,0ul>(this,opcode >> 9 & 7);
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,uVar2,local_28,&local_29);
    if (local_29 == false) {
      uVar2 = (this->reg).pc;
      (this->reg).pc0 = uVar2;
      (this->queue).ird = (this->queue).irc;
      uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
      (this->queue).irc = (u16)uVar2;
    }
  }
  return;
}

Assistant:

void
Moira::execMove7(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
    
    if (!writeOp <MODE_AW,S> (dst, data)) return;
    
    prefetch<POLLIPL>();
}